

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall
irr::video::CImage::copyToScaling
          (CImage *this,void *target,u32 width,u32 height,ECOLOR_FORMAT format,u32 pitch)

{
  bool bVar1;
  u32 uVar2;
  ulong uVar3;
  ECOLOR_FORMAT in_ECX;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  ECOLOR_FORMAT in_R8D;
  int in_R9D;
  double __x;
  u32 x;
  f32 sx;
  u32 y;
  f32 sy;
  s32 syval;
  s32 yval;
  f32 sourceYStart;
  f32 sourceXStart;
  f32 sourceYStep;
  f32 sourceXStep;
  u32 bpp;
  float local_60;
  uint local_4c;
  ECOLOR_FORMAT dF;
  int iVar4;
  int sN;
  float fVar5;
  float sF;
  undefined4 uVar6;
  int local_20;
  
  bVar1 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI + 1));
  if (bVar1) {
    os::Printer::log((Printer *)"IImage::copyToScaling method doesn\'t work with compressed images."
                     ,__x);
  }
  else if ((((in_RSI != 0) && (in_EDX != 0)) && (in_ECX != ECF_A1R5G5B5)) &&
          ((*(int *)((long)in_RDI + 0xc) != 0 && ((int)in_RDI[2] != 0)))) {
    uVar2 = IImage::getBitsPerPixelFromFormat(in_R8D);
    local_20 = in_R9D;
    if (in_R9D == 0) {
      local_20 = in_EDX * (uVar2 >> 3);
    }
    uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,local_20);
    if ((uVar3 & 1) == 0) {
      uVar6 = 0;
      fVar5 = 0.0;
      if (in_EDX % *(uint *)((long)in_RDI + 0xc) != 0) {
        uVar6 = 0x3f000000;
      }
      if (in_ECX % *(uint *)(in_RDI + 2) == 0) {
        local_60 = (float)*(uint *)(in_RDI + 2) / (float)in_ECX;
      }
      else {
        if (in_ECX < ECF_R8G8B8) {
          local_60 = 0.0;
        }
        else {
          local_60 = (float)((int)in_RDI[2] - 1) / (float)(in_ECX - ECF_R5G6B5);
        }
        fVar5 = 0.5;
      }
      sN = 0;
      iVar4 = 0;
      sF = fVar5;
      for (dF = ECF_A1R5G5B5; dF < in_ECX; dF = dF + ECF_R5G6B5) {
        for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
          CColorConverter::convert_viaFormat
                    ((void *)CONCAT44(local_60,uVar6),(ECOLOR_FORMAT)sF,sN,
                     (void *)CONCAT44(iVar4,fVar5),dF);
        }
        fVar5 = local_60 + fVar5;
        iVar4 = (int)fVar5 * *(int *)((long)in_RDI + 0x2c);
        sN = local_20 + sN;
      }
    }
  }
  return;
}

Assistant:

void CImage::copyToScaling(void *target, u32 width, u32 height, ECOLOR_FORMAT format, u32 pitch)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScaling method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	if (!target || !width || !height || !Size.Width || !Size.Height)
		return;

	const u32 bpp = getBitsPerPixelFromFormat(format) / 8;
	if (0 == pitch)
		pitch = width * bpp;

	if (copyToNoScaling(target, width, height, format, pitch))
		return;

	// NOTE: Scaling is coded to keep the border pixels intact.
	// Alternatively we could for example work with first pixel being taken at half step-size.
	// Then we have one more step here and it would be:
	//     sourceXStep = (f32)(Size.Width-1) / (f32)(width);
	//     And sx would start at 0.5f + sourceXStep / 2.f;
	//     Similar for y.
	// As scaling is done without any antialiasing it doesn't matter too much which outermost pixels we use and keeping
	// border pixels intact is probably mostly better (with AA the other solution would be more correct).
	// This is however unnecessary (and unexpected) for scaling to integer multiples, so don't do it there.
	f32 sourceXStep, sourceYStep;
	f32 sourceXStart = 0.f, sourceYStart = 0.f;
	if (width % Size.Width == 0)
		sourceXStep = (f32)(Size.Width) / (f32)(width);
	else {
		sourceXStep = width > 1 ? (f32)(Size.Width - 1) / (f32)(width - 1) : 0.f;
		sourceXStart = 0.5f; // for rounding to nearest pixel
	}
	if (height % Size.Height == 0)
		sourceYStep = (f32)(Size.Height) / (f32)(height);
	else {
		sourceYStep = height > 1 ? (f32)(Size.Height - 1) / (f32)(height - 1) : 0.f;
		sourceYStart = 0.5f; // for rounding to nearest pixel
	}

	s32 yval = 0, syval = 0;
	f32 sy = sourceYStart;
	for (u32 y = 0; y < height; ++y) {
		f32 sx = sourceXStart;
		for (u32 x = 0; x < width; ++x) {
			CColorConverter::convert_viaFormat(Data + syval + ((s32)sx) * BytesPerPixel, Format, 1, ((u8 *)target) + yval + (x * bpp), format);
			sx += sourceXStep;
		}
		sy += sourceYStep;
		syval = (s32)(sy)*Pitch;
		yval += pitch;
	}
}